

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5SSBOArrayIndexing.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GPUShader5SSBOArrayIndexing::iterate(GPUShader5SSBOArrayIndexing *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  MessageBuilder local_1d8;
  GLuint *local_58;
  GLuint *compute_SSBO;
  GLuint index;
  bool test_failed;
  GLuint expected_result [4];
  GLint index_location;
  Functions *gl;
  GPUShader5SSBOArrayIndexing *this_local;
  long lVar4;
  
  initTest(this);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x1680))(this->m_program_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Could not use program!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                  ,0x98);
  iVar1 = (**(code **)(lVar4 + 0xb48))(this->m_program_id,"index");
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGetUniformLocation() call failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                  ,0x9b);
  if (iVar1 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Index uniform location is inactive which is invalid!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
               ,0x9f);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar4 + 0x1500))(iVar1,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Could not set value of index uniform variable!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                  ,0xa4);
  (**(code **)(lVar4 + 0x528))(1,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Could not dispatch compute!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                  ,0xa9);
  (**(code **)(lVar4 + 0xdb8))(0x2000);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Could not set memory barrier!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                  ,0xac);
  (**(code **)(lVar4 + 0x1500))(iVar1,3);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Could not set value to index uniform variable!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                  ,0xaf);
  (**(code **)(lVar4 + 0x528))(1,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Could not dispatch compute!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                  ,0xb4);
  (**(code **)(lVar4 + 0xdb8))(0x2000);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Could not set memory barrier!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                  ,0xb7);
  _index = 0x2400000000;
  expected_result[0] = 0;
  expected_result[1] = 0x24;
  compute_SSBO._7_1_ = 0;
  for (compute_SSBO._0_4_ = 0; (uint)compute_SSBO < 4; compute_SSBO._0_4_ = (uint)compute_SSBO + 1)
  {
    (**(code **)(lVar4 + 0x40))(0x90d2,this->m_ssbo_buffer_ids[(uint)compute_SSBO]);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Could not bind a buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                    ,0xc0);
    local_58 = (GLuint *)(**(code **)(lVar4 + 0xd00))(0x90d2,0,4,1);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Could not map buffer data to client memory",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                    ,0xc5);
    if (*local_58 != (&index)[(uint)compute_SSBO]) {
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1d8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [16])"Expected Data (");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&index + (uint)compute_SSBO);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2b47c71);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [14])0x2ad8e90);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_58);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a85ff4);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1d8);
      compute_SSBO._7_1_ = 1;
    }
    (**(code **)(lVar4 + 0x1670))(0x90d2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Could not unmap buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                    ,0xd0);
  }
  if ((compute_SSBO._7_1_ & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShader5SSBOArrayIndexing::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Activate the program object and retrieve index uniform location */
	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program!");

	glw::GLint index_location = gl.getUniformLocation(m_program_id, "index");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call failed!");

	if (index_location == -1)
	{
		TCU_FAIL("Index uniform location is inactive which is invalid!");
	}

	/* Issue a few compute operations */
	gl.uniform1ui(index_location, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set value of index uniform variable!");

	gl.dispatchCompute(1,  /* num_groups_x */
					   1,  /* num_groups_y */
					   1); /* num_groups_z */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not dispatch compute!");

	gl.memoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set memory barrier!");

	gl.uniform1ui(index_location, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set value to index uniform variable!");

	gl.dispatchCompute(1,  /* num_groups_x */
					   1,  /* num_groups_y */
					   1); /* num_groups_z */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not dispatch compute!");

	gl.memoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set memory barrier!");

	/* Validate the results */
	glw::GLuint expected_result[m_n_arrays] = { 0, 36, 0, 36 };
	bool		test_failed					= false;

	for (glw::GLuint index = 0; index < m_n_arrays; ++index)
	{
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo_buffer_ids[index]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a buffer object!");

		const glw::GLuint* compute_SSBO =
			(const glw::GLuint*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(glw::GLuint), GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map buffer data to client memory");

		if (compute_SSBO[0] != expected_result[index])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Expected Data (" << expected_result[index] << ") "
							   << "Result Data (" << compute_SSBO[0] << ")" << tcu::TestLog::EndMessage;

			test_failed = true;
		}

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not unmap buffer");
	}

	if (test_failed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}